

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::_::IdentityFunc<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:5221:24)>
::getImpl(TransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::_::IdentityFunc<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:5221:24)>
          *this,ExceptionOrValue *output)

{
  char (*params) [17];
  Exception *this_00;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> depResult;
  Array<char> local_578;
  undefined1 local_558 [40];
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_530;
  Exception local_368;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_1d8;
  
  local_1d8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1d8.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_1d8.super_ExceptionOrValue);
  if (local_1d8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::Exception(&local_368,&local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value);
    str<char_const(&)[17]>((String *)&local_578,(kj *)"irrelevant value",params);
    local_558._0_4_ = 1;
    local_558._8_8_ = local_578.ptr;
    local_558._16_8_ = local_578.size_;
    local_558._24_8_ = local_578.disposer;
    local_578.ptr = (char *)0x0;
    local_578.size_ = 0;
    Array<char>::~Array(&local_578);
    Exception::~Exception(&local_368);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::ExceptionOr
              (&local_530,
               (OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)local_558);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::operator=
              ((ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                *)output,&local_530);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    ~ExceptionOr(&local_530);
    this_00 = (Exception *)local_558;
  }
  else {
    if (local_1d8.value.ptr.isSet != true) goto LAB_002c03a5;
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::moveFrom
              ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)&local_368,
               &local_1d8.value.ptr.field_1.value);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::ExceptionOr
              (&local_530,
               (OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)&local_368);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::operator=
              ((ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                *)output,&local_530);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    ~ExceptionOr(&local_530);
    this_00 = &local_368;
  }
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf
            ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)this_00);
LAB_002c03a5:
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~ExceptionOr
            (&local_1d8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }